

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::checkMultiplierCharacter(string *unit_string,uint64_t match_flags,char mchar)

{
  ulong uVar1;
  char cVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  void *pvVar6;
  ulong __pos;
  ulong uVar7;
  int iVar8;
  precise_unit pVar9;
  precise_unit pVar10;
  string ustring;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  uint64_t local_78;
  string local_70;
  string local_50;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  uVar7 = unit_string->_M_string_length;
  iVar8 = (int)mchar;
  local_78 = match_flags;
  if (uVar7 == 0) {
    __pos = 0xffffffffffffffff;
  }
  else {
    pcVar3 = (unit_string->_M_dataplus)._M_p;
    pvVar6 = memchr(pcVar3,iVar8,uVar7);
    __pos = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)pcVar3;
  }
  if (__pos != 0xffffffffffffffff) {
    uVar1 = __pos + 1;
    if ((uVar7 < uVar1 || uVar7 - uVar1 == 0) ||
       (pcVar3 = (unit_string->_M_dataplus)._M_p,
       pvVar6 = memchr(pcVar3 + uVar1,iVar8,uVar7 - uVar1),
       pvVar6 == (void *)0x0 || (long)pvVar6 - (long)pcVar3 == -1)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&local_98,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&local_98,__pos,1);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      pVar9 = unit_quick_match(&local_50,local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((pVar9._8_8_ & 0xffffffff) != 0xfa94a488 && !NAN(pVar9.multiplier_)) goto LAB_0040a171;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string);
    do {
      if (__pos == local_98._M_string_length - 1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&local_98,__pos,1);
      }
      else {
        cVar2 = local_98._M_dataplus._M_p[__pos + 1];
        if ((byte)(cVar2 - 0x30U) < 10) {
          if (__pos == 0) {
            __pos = 0;
          }
          else if (local_98._M_dataplus._M_p[__pos - 1] != '^') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert(&local_98,__pos,1,'^');
            __pos = __pos + 1;
          }
        }
        else {
          if (cVar2 == mchar) goto LAB_0040a16b;
          if ((cVar2 != '(') && (cVar2 != '[')) {
            local_98._M_dataplus._M_p[__pos] = '*';
          }
        }
      }
      _Var4._M_p = local_98._M_dataplus._M_p;
      uVar7 = __pos + 2;
      __pos = 0xffffffffffffffff;
      if (uVar7 <= local_98._M_string_length && local_98._M_string_length - uVar7 != 0) {
        pvVar6 = memchr(local_98._M_dataplus._M_p + uVar7,iVar8,local_98._M_string_length - uVar7);
        __pos = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)_Var4._M_p;
      }
      sVar5 = local_98._M_string_length;
    } while (__pos != 0xffffffffffffffff);
    if ((local_98._M_string_length != unit_string->_M_string_length) ||
       ((local_98._M_string_length != 0 &&
        (iVar8 = bcmp(local_98._M_dataplus._M_p,(unit_string->_M_dataplus)._M_p,
                      local_98._M_string_length), iVar8 != 0)))) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_98._M_dataplus._M_p,local_98._M_dataplus._M_p + sVar5);
      pVar10 = unit_from_string_internal(&local_70,local_78 | 0x400000000);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pVar9.base_units_ = (unit_data)0xfa94a488;
      pVar9.commodity_ = 0;
      pVar9.multiplier_ = NAN;
      if ((pVar10._8_8_ & 0xffffffff) != 0xfa94a488 && !NAN(pVar10.multiplier_)) {
        pVar9 = pVar10;
      }
      goto LAB_0040a171;
    }
  }
LAB_0040a16b:
  pVar9.base_units_ = (unit_data)0xfa94a488;
  pVar9.commodity_ = 0;
  pVar9.multiplier_ = NAN;
LAB_0040a171:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return pVar9;
}

Assistant:

static precise_unit checkMultiplierCharacter(
    const std::string& unit_string,
    std::uint64_t match_flags,
    char mchar)
{
    // assume mchar means multiply
    std::string ustring;
    precise_unit retunit;
    auto fd = unit_string.find_first_of(mchar);
    if (fd != std::string::npos) {
        // if there is a single one just check for a merged unit
        if (unit_string.find_first_of(mchar, fd + 1) == std::string::npos) {
            ustring = unit_string;
            ustring.erase(fd, 1);
            retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
        ustring = unit_string;
        while (fd != std::string::npos) {
            if (fd == ustring.size() - 1) {
                ustring.erase(fd, 1);
            } else if (isDigitCharacter(ustring[fd + 1])) {
                if (fd > 0 && ustring[fd - 1] != '^') {
                    ustring.insert(fd, 1, '^');
                    fd += 1;
                }
            } else if (ustring[fd + 1] == mchar) {
                // repeated characters,  cannot mean separator
                return precise::invalid;
            } else if (ustring[fd + 1] != '[' && ustring[fd + 1] != '(') {
                ustring[fd] = '*';
            }
            // ignore adjacent ones
            fd = ustring.find_first_of(mchar, fd + 2);
        }
        if (ustring != unit_string) {
            retunit = unit_from_string_internal(
                ustring, match_flags | skip_partition_check);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}